

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O2

Statement * parseState(string *line,bool flag)

{
  bool bVar1;
  int iVar2;
  StateIf *this;
  CompoundExp *this_00;
  Expression *pEVar3;
  undefined **ppuVar4;
  long lVar5;
  Expression *pEVar6;
  undefined8 uVar7;
  string *psVar8;
  ErrorException err;
  string local_338;
  string s1;
  string first_token;
  string s2;
  TokenScanner scanner;
  string local_250 [2];
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110 [2];
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string token;
  
  TokenScanner::TokenScanner(&scanner);
  TokenScanner::ignoreWhitespace(&scanner);
  TokenScanner::scanNumbers(&scanner);
  std::__cxx11::string::string((string *)&local_70,(string *)line);
  TokenScanner::setInput(&scanner,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  first_token._M_dataplus._M_p = (pointer)&first_token.field_2;
  first_token._M_string_length = 0;
  token._M_dataplus._M_p = (pointer)&token.field_2;
  token._M_string_length = 0;
  first_token.field_2._M_local_buf[0] = '\0';
  token.field_2._M_local_buf[0] = '\0';
  if (flag) {
    TokenScanner::nextToken_abi_cxx11_((string *)&err,&scanner);
    std::__cxx11::string::operator=((string *)&first_token,(string *)&err);
    std::__cxx11::string::~string((string *)&err);
  }
  TokenScanner::nextToken_abi_cxx11_((string *)&err,&scanner);
  std::__cxx11::string::operator=((string *)&first_token,(string *)&err);
  std::__cxx11::string::~string((string *)&err);
  bVar1 = std::operator==(&first_token,"LET");
  if (bVar1) {
    this = (StateIf *)operator_new(0x10);
    StateLet::StateLet((StateLet *)this,&scanner);
    goto LAB_00108dcc;
  }
  bVar1 = std::operator==(&first_token,"PRINT");
  if (bVar1) {
    this_00 = (CompoundExp *)parseExp(&scanner);
    iVar2 = (*(this_00->super_Expression)._vptr_Expression[4])(this_00);
    if (iVar2 == 2) {
      CompoundExp::getOp_abi_cxx11_((string *)&err,this_00);
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &err,"=");
      std::__cxx11::string::~string((string *)&err);
      if (bVar1) {
        std::__cxx11::string::string((string *)&local_90,"SYNTAX ERROR",(allocator *)&err);
        error(&local_90);
        std::__cxx11::string::~string((string *)&local_90);
      }
    }
    this = (StateIf *)operator_new(0x10);
    (this->super_Statement)._vptr_Statement = (_func_int **)&PTR__StatePrint_0010ebf8;
    this->exp1 = (Expression *)this_00;
    goto LAB_00108dcc;
  }
  bVar1 = std::operator==(&first_token,"INPUT");
  if (bVar1) {
    pEVar3 = parseExp(&scanner);
    iVar2 = (*pEVar3->_vptr_Expression[4])(pEVar3);
    if (iVar2 != 1) {
      std::__cxx11::string::string((string *)&local_b0,"SYNTAX ERROR",(allocator *)&err);
      error(&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
    }
    this = (StateIf *)operator_new(0x10);
    (this->super_Statement)._vptr_Statement = (_func_int **)&PTR__StateInput_0010ebd0;
    this->exp1 = pEVar3;
    goto LAB_00108dcc;
  }
  bVar1 = std::operator==(&first_token,"REM");
  if (bVar1) {
    this = (StateIf *)operator_new(8);
    ppuVar4 = &PTR__StateRem_0010eb58;
  }
  else {
    bVar1 = std::operator==(&first_token,"END");
    if (!bVar1) {
      bVar1 = std::operator==(&first_token,"IF");
      if (bVar1) {
        lVar5 = std::__cxx11::string::find((char *)line,0x10a057);
        if (lVar5 != -1) {
          err._0_8_ = &err.msg._M_string_length;
          err.msg._M_dataplus._M_p = (pointer)0x0;
          err.msg._M_string_length._0_1_ = 0;
          s1._M_dataplus._M_p = (pointer)&s1.field_2;
          s1._M_string_length = 0;
          s2._M_dataplus._M_p = (pointer)&s2.field_2;
          s2._M_string_length = 0;
          s1.field_2._M_local_buf[0] = '\0';
          s2.field_2._M_local_buf[0] = '\0';
          while( true ) {
            bVar1 = TokenScanner::hasMoreTokens(&scanner);
            if (!bVar1) break;
            TokenScanner::nextToken_abi_cxx11_(&local_338,&scanner);
            std::__cxx11::string::operator=((string *)&err,(string *)&local_338);
            std::__cxx11::string::~string((string *)&local_338);
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&err,"=");
            if (bVar1) break;
            std::operator+(&local_338,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&err
                           ,' ');
            std::__cxx11::string::append((string *)&s1);
            std::__cxx11::string::~string((string *)&local_338);
          }
          do {
            bVar1 = TokenScanner::hasMoreTokens(&scanner);
            if (!bVar1) goto LAB_001089eb;
            TokenScanner::nextToken_abi_cxx11_(&local_338,&scanner);
            std::__cxx11::string::operator=((string *)&err,(string *)&local_338);
            std::__cxx11::string::~string((string *)&local_338);
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&err,"THEN");
            if (bVar1) goto LAB_001089eb;
            std::operator+(&local_338,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&err
                           ,' ');
            std::__cxx11::string::append((string *)&s2);
            std::__cxx11::string::~string((string *)&local_338);
          } while( true );
        }
        pEVar3 = readE(&scanner,0);
        TokenScanner::nextToken_abi_cxx11_((string *)&err,&scanner);
        pEVar6 = readE(&scanner,0);
        TokenScanner::nextToken_abi_cxx11_(&s1,&scanner);
        TokenScanner::nextToken_abi_cxx11_(&s2,&scanner);
        std::__cxx11::string::operator=((string *)&s1,(string *)&s2);
        std::__cxx11::string::~string((string *)&s2);
        std::__cxx11::string::string((string *)&local_d0,(string *)&s1);
        iVar2 = stringToInteger(&local_d0);
        std::__cxx11::string::~string((string *)&local_d0);
        bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&err,"=");
        if (bVar1) {
          bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&err,"<");
          if (!bVar1) goto LAB_00108bcf;
          bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&err,">");
          if (!bVar1) goto LAB_00108bcf;
LAB_00108be0:
          if (pEVar3 != (Expression *)0x0) {
            (*pEVar3->_vptr_Expression[1])(pEVar3);
          }
          if (pEVar6 != (Expression *)0x0) {
            (*pEVar6->_vptr_Expression[1])(pEVar6);
          }
          std::__cxx11::string::string((string *)local_110,"SYNTAX ERROR",(allocator *)&s2);
          error(local_110);
          std::__cxx11::string::~string((string *)local_110);
        }
        else {
LAB_00108bcf:
          bVar1 = TokenScanner::hasMoreTokens(&scanner);
          if (bVar1) goto LAB_00108be0;
        }
        this = (StateIf *)operator_new(0x40);
        std::__cxx11::string::string((string *)&local_130,(string *)&err);
        StateIf::StateIf(this,pEVar3,&local_130,pEVar6,iVar2);
        psVar8 = &local_130;
        goto LAB_00108db3;
      }
      bVar1 = std::operator==(&first_token,"GOTO");
      if (!bVar1) {
        std::__cxx11::string::string((string *)local_250,"SYNTAX ERROR",(allocator *)&err);
        error(local_250);
        uVar7 = std::__cxx11::string::~string((string *)local_250);
        std::__cxx11::string::~string((string *)local_110);
        std::__cxx11::string::~string((string *)&s1);
        std::__cxx11::string::~string((string *)&err);
        std::__cxx11::string::~string((string *)&token);
        std::__cxx11::string::~string((string *)&first_token);
        TokenScanner::~TokenScanner(&scanner);
        _Unwind_Resume(uVar7);
      }
      TokenScanner::nextToken_abi_cxx11_((string *)&err,&scanner);
      bVar1 = TokenScanner::hasMoreTokens(&scanner);
      if (bVar1) {
        std::__cxx11::string::string((string *)&local_1f0,"SYNTAX ERROR",(allocator *)&s1);
        error(&local_1f0);
        std::__cxx11::string::~string((string *)&local_1f0);
      }
      std::__cxx11::string::string((string *)&local_210,(string *)&err);
      iVar2 = stringToInteger(&local_210);
      std::__cxx11::string::~string((string *)&local_210);
      this = (StateIf *)operator_new(0x10);
      (this->super_Statement)._vptr_Statement = (_func_int **)&PTR__StateRem_0010ec48;
      *(int *)&this->exp1 = iVar2;
      goto LAB_00108dc2;
    }
    this = (StateIf *)operator_new(8);
    ppuVar4 = &PTR__StateRem_0010ec20;
  }
  (this->super_Statement)._vptr_Statement = (_func_int **)ppuVar4;
  goto LAB_00108dcc;
LAB_001089eb:
  bVar1 = TokenScanner::hasMoreTokens(&scanner);
  if (bVar1) {
    TokenScanner::nextToken_abi_cxx11_(&local_338,&scanner);
    psVar8 = &local_338;
    std::__cxx11::string::operator=((string *)&err,(string *)psVar8);
  }
  else {
    std::__cxx11::string::string((string *)&local_150,"SYNTAX ERROR",(allocator *)&local_338);
    error(&local_150);
    psVar8 = &local_150;
  }
  std::__cxx11::string::~string((string *)psVar8);
  std::__cxx11::string::string((string *)&local_170,(string *)&s1);
  TokenScanner::setInput(&scanner,&local_170);
  std::__cxx11::string::~string((string *)&local_170);
  pEVar3 = parseExp(&scanner);
  std::__cxx11::string::string((string *)&local_190,(string *)&s2);
  TokenScanner::setInput(&scanner,&local_190);
  std::__cxx11::string::~string((string *)&local_190);
  pEVar6 = parseExp(&scanner);
  std::__cxx11::string::string((string *)&local_1b0,(string *)&err);
  iVar2 = stringToInteger(&local_1b0);
  std::__cxx11::string::~string((string *)&local_1b0);
  this = (StateIf *)operator_new(0x40);
  std::__cxx11::string::string((string *)&local_1d0,"=",(allocator *)&local_338);
  StateIf::StateIf(this,pEVar3,&local_1d0,pEVar6,iVar2);
  std::__cxx11::string::~string((string *)&local_1d0);
  psVar8 = &s2;
LAB_00108db3:
  std::__cxx11::string::~string((string *)psVar8);
  std::__cxx11::string::~string((string *)&s1);
LAB_00108dc2:
  std::__cxx11::string::~string((string *)&err);
LAB_00108dcc:
  std::__cxx11::string::~string((string *)&token);
  std::__cxx11::string::~string((string *)&first_token);
  TokenScanner::~TokenScanner(&scanner);
  return &this->super_Statement;
}

Assistant:

Statement *parseState(string line, bool flag) {
    TokenScanner scanner;
    scanner.ignoreWhitespace();
    scanner.scanNumbers();
    scanner.setInput(line);
    string first_token, token;
    if (flag) {
        first_token = scanner.nextToken();
    }
    Statement *sta = nullptr;
    Expression *exp = nullptr;
    Expression *exp1 = nullptr;
    Expression *exp2 = nullptr;
    first_token = scanner.nextToken();
    if (first_token == "LET") {
        try {
            sta = new StateLet(scanner);
            return sta;
        }
        catch (ErrorException err) {
            if (sta != nullptr) delete sta;
            throw err;
        } catch (...) {

        }
    } else if (first_token == "PRINT") {
        try {
            exp = parseExp(scanner);
            if (exp->getType()==COMPOUND)
                if (((CompoundExp*)exp)->getOp()=="=") error("SYNTAX ERROR");
            sta = new StatePrint(exp);
            return sta;
        } catch (ErrorException err) {
            if (exp != nullptr) delete exp;
            if (sta != nullptr) delete sta;
            throw err;
        }
    } else if (first_token == "INPUT") {
        try {
            exp = parseExp(scanner);
            if (exp->getType() != IDENTIFIER) error("SYNTAX ERROR");
            return new StateInput(exp);
        } catch (ErrorException err) {
            if (exp != nullptr) delete exp;
            throw err;
        } catch (...) {
            if (exp != nullptr) delete exp;
        }
    } else if (first_token == "REM") {
        return new StateRem;
    } else if (first_token == "END") {
        return new StateEnd;
    } else if (first_token == "IF") {
        if (line.find("=") == string::npos) {
            exp1 = readE(scanner);
            string cmp = scanner.nextToken();
            exp2 = readE(scanner);
            string tmp = scanner.nextToken();
            tmp = scanner.nextToken();
            int line_number;
            try {
                line_number = stringToInteger(tmp);
            } catch (...) {
                delete exp1;
                delete exp2;
                error("SYNTAX ERROR");
            }
            if ((cmp != "=" && cmp != "<" && cmp != ">") || scanner.hasMoreTokens()) {
                delete exp1;
                delete exp2;
                error("SYNTAX ERROR");
            }
            return new StateIf(exp1, cmp, exp2, line_number);
        }else {
            string token,s1,s2;
            while (scanner.hasMoreTokens()){
                token=scanner.nextToken();
                if (token=="=") break;
                s1+=token+' ';
            }
            while (scanner.hasMoreTokens()){
                token=scanner.nextToken();
                if (token=="THEN") break;
                s2+=token+' ';
            }
            if (scanner.hasMoreTokens())
                token=scanner.nextToken();
            else error("SYNTAX ERROR");
            scanner.setInput(s1);
            exp1=parseExp(scanner);
            scanner.setInput(s2);
            exp2=parseExp(scanner);
            int line_number=stringToInteger(token);
            return new StateIf(exp1,"=",exp2,line_number);
        }
    } else if (first_token == "GOTO") {
        string s = scanner.nextToken();
        int lineNumber;
        if (scanner.hasMoreTokens()) error("SYNTAX ERROR");
        try {
            lineNumber = stringToInteger(s);
        } catch (...) {
            error("SYNTAX ERROR");
        }
        return new StateGoto(lineNumber);
    } else error("SYNTAX ERROR");
}